

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDefaultCollisionConfiguration.cpp
# Opt level: O3

void __thiscall
cbtDefaultCollisionConfiguration::cbtDefaultCollisionConfiguration
          (cbtDefaultCollisionConfiguration *this,
          cbtDefaultCollisionConstructionInfo *constructionInfo)

{
  cbtConvexPenetrationDepthSolver *pcVar1;
  CreateFunc *this_00;
  cbtCollisionAlgorithmCreateFunc *pcVar2;
  cbtPoolAllocator *pcVar3;
  uint uVar4;
  undefined *puVar5;
  
  (this->super_cbtCollisionConfiguration)._vptr_cbtCollisionConfiguration =
       (_func_int **)&PTR__cbtDefaultCollisionConfiguration_00b489c8;
  if (constructionInfo->m_useEpaPenetrationAlgorithm == 0) {
    puVar5 = &cbtMinkowskiPenetrationDepthSolver::vtable;
  }
  else {
    puVar5 = &cbtGjkEpaPenetrationDepthSolver::vtable;
  }
  pcVar1 = (cbtConvexPenetrationDepthSolver *)cbtAlignedAllocInternal(8,0x10);
  pcVar1->_vptr_cbtConvexPenetrationDepthSolver = (_func_int **)(puVar5 + 0x10);
  this->m_pdSolver = pcVar1;
  this_00 = (CreateFunc *)cbtAlignedAllocInternal(0x20,0x10);
  cbtConvexConvexAlgorithm::CreateFunc::CreateFunc(this_00,this->m_pdSolver);
  this->m_convexConvexCreateFunc = (cbtCollisionAlgorithmCreateFunc *)this_00;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48a30;
  this->m_convexConcaveCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48a70;
  this->m_swappedConvexConcaveCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48ab0;
  this->m_compoundCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48af0;
  this->m_compoundCompoundCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48b30;
  this->m_swappedCompoundCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b3ccf8;
  this->m_emptyCreateFunc = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48b70;
  this->m_sphereSphereCF = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48bb0;
  this->m_sphereTriangleCF = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48bb0;
  this->m_triangleSphereCF = pcVar2;
  pcVar2->m_swapped = true;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48bf0;
  this->m_boxBoxCF = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x18,0x10);
  pcVar2->m_swapped = false;
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48c30;
  *(undefined8 *)&pcVar2->field_0xc = 1;
  this->m_convexPlaneCF = pcVar2;
  pcVar2 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x18,0x10);
  pcVar2->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_00b48c30;
  *(undefined8 *)&pcVar2->field_0xc = 1;
  this->m_planeConvexCF = pcVar2;
  pcVar2->m_swapped = true;
  pcVar3 = constructionInfo->m_persistentManifoldPool;
  uVar4 = 0xb8;
  if (0xb8 < constructionInfo->m_customCollisionAlgorithmMaxElementSize) {
    uVar4 = constructionInfo->m_customCollisionAlgorithmMaxElementSize;
  }
  if (pcVar3 == (cbtPoolAllocator *)0x0) {
    this->m_ownsPersistentManifoldPool = true;
    pcVar3 = (cbtPoolAllocator *)cbtAlignedAllocInternal(0x28,0x10);
    cbtPoolAllocator::cbtPoolAllocator
              (pcVar3,0x3b0,constructionInfo->m_defaultMaxPersistentManifoldPoolSize);
  }
  else {
    this->m_ownsPersistentManifoldPool = false;
  }
  this->m_persistentManifoldPool = pcVar3;
  pcVar3 = constructionInfo->m_collisionAlgorithmPool;
  if (pcVar3 == (cbtPoolAllocator *)0x0) {
    this->m_ownsCollisionAlgorithmPool = true;
    pcVar3 = (cbtPoolAllocator *)cbtAlignedAllocInternal(0x28,0x10);
    cbtPoolAllocator::cbtPoolAllocator
              (pcVar3,(uVar4 & 0x7ffffff0) + 0x10,
               constructionInfo->m_defaultMaxCollisionAlgorithmPoolSize);
  }
  else {
    this->m_ownsCollisionAlgorithmPool = false;
  }
  this->m_collisionAlgorithmPool = pcVar3;
  return;
}

Assistant:

cbtDefaultCollisionConfiguration::cbtDefaultCollisionConfiguration(const cbtDefaultCollisionConstructionInfo& constructionInfo)
//cbtDefaultCollisionConfiguration::cbtDefaultCollisionConfiguration(cbtStackAlloc*	stackAlloc,cbtPoolAllocator*	persistentManifoldPool,cbtPoolAllocator*	collisionAlgorithmPool)
{
	void* mem = NULL;
	if (constructionInfo.m_useEpaPenetrationAlgorithm)
	{
		mem = cbtAlignedAlloc(sizeof(cbtGjkEpaPenetrationDepthSolver), 16);
		m_pdSolver = new (mem) cbtGjkEpaPenetrationDepthSolver;
	}
	else
	{
		mem = cbtAlignedAlloc(sizeof(cbtMinkowskiPenetrationDepthSolver), 16);
		m_pdSolver = new (mem) cbtMinkowskiPenetrationDepthSolver;
	}

	//default CreationFunctions, filling the m_doubleDispatch table
	mem = cbtAlignedAlloc(sizeof(cbtConvexConvexAlgorithm::CreateFunc), 16);
	m_convexConvexCreateFunc = new (mem) cbtConvexConvexAlgorithm::CreateFunc(m_pdSolver);
	mem = cbtAlignedAlloc(sizeof(cbtConvexConcaveCollisionAlgorithm::CreateFunc), 16);
	m_convexConcaveCreateFunc = new (mem) cbtConvexConcaveCollisionAlgorithm::CreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtConvexConcaveCollisionAlgorithm::CreateFunc), 16);
	m_swappedConvexConcaveCreateFunc = new (mem) cbtConvexConcaveCollisionAlgorithm::SwappedCreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtCompoundCollisionAlgorithm::CreateFunc), 16);
	m_compoundCreateFunc = new (mem) cbtCompoundCollisionAlgorithm::CreateFunc;

	mem = cbtAlignedAlloc(sizeof(cbtCompoundCompoundCollisionAlgorithm::CreateFunc), 16);
	m_compoundCompoundCreateFunc = new (mem) cbtCompoundCompoundCollisionAlgorithm::CreateFunc;

	mem = cbtAlignedAlloc(sizeof(cbtCompoundCollisionAlgorithm::SwappedCreateFunc), 16);
	m_swappedCompoundCreateFunc = new (mem) cbtCompoundCollisionAlgorithm::SwappedCreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtEmptyAlgorithm::CreateFunc), 16);
	m_emptyCreateFunc = new (mem) cbtEmptyAlgorithm::CreateFunc;

	mem = cbtAlignedAlloc(sizeof(cbtSphereSphereCollisionAlgorithm::CreateFunc), 16);
	m_sphereSphereCF = new (mem) cbtSphereSphereCollisionAlgorithm::CreateFunc;
#ifdef USE_BUGGY_SPHERE_BOX_ALGORITHM
	mem = cbtAlignedAlloc(sizeof(cbtSphereBoxCollisionAlgorithm::CreateFunc), 16);
	m_sphereBoxCF = new (mem) cbtSphereBoxCollisionAlgorithm::CreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtSphereBoxCollisionAlgorithm::CreateFunc), 16);
	m_boxSphereCF = new (mem) cbtSphereBoxCollisionAlgorithm::CreateFunc;
	m_boxSphereCF->m_swapped = true;
#endif  //USE_BUGGY_SPHERE_BOX_ALGORITHM

	mem = cbtAlignedAlloc(sizeof(cbtSphereTriangleCollisionAlgorithm::CreateFunc), 16);
	m_sphereTriangleCF = new (mem) cbtSphereTriangleCollisionAlgorithm::CreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtSphereTriangleCollisionAlgorithm::CreateFunc), 16);
	m_triangleSphereCF = new (mem) cbtSphereTriangleCollisionAlgorithm::CreateFunc;
	m_triangleSphereCF->m_swapped = true;

	mem = cbtAlignedAlloc(sizeof(cbtBoxBoxCollisionAlgorithm::CreateFunc), 16);
	m_boxBoxCF = new (mem) cbtBoxBoxCollisionAlgorithm::CreateFunc;

	//convex versus plane
	mem = cbtAlignedAlloc(sizeof(cbtConvexPlaneCollisionAlgorithm::CreateFunc), 16);
	m_convexPlaneCF = new (mem) cbtConvexPlaneCollisionAlgorithm::CreateFunc;
	mem = cbtAlignedAlloc(sizeof(cbtConvexPlaneCollisionAlgorithm::CreateFunc), 16);
	m_planeConvexCF = new (mem) cbtConvexPlaneCollisionAlgorithm::CreateFunc;
	m_planeConvexCF->m_swapped = true;

	///calculate maximum element size, big enough to fit any collision algorithm in the memory pool
	int maxSize = sizeof(cbtConvexConvexAlgorithm);
	int maxSize2 = sizeof(cbtConvexConcaveCollisionAlgorithm);
	int maxSize3 = sizeof(cbtCompoundCollisionAlgorithm);
	int maxSize4 = sizeof(cbtCompoundCompoundCollisionAlgorithm);

	int collisionAlgorithmMaxElementSize = cbtMax(maxSize, constructionInfo.m_customCollisionAlgorithmMaxElementSize);
	collisionAlgorithmMaxElementSize = cbtMax(collisionAlgorithmMaxElementSize, maxSize2);
	collisionAlgorithmMaxElementSize = cbtMax(collisionAlgorithmMaxElementSize, maxSize3);
	collisionAlgorithmMaxElementSize = cbtMax(collisionAlgorithmMaxElementSize, maxSize4);

	if (constructionInfo.m_persistentManifoldPool)
	{
		m_ownsPersistentManifoldPool = false;
		m_persistentManifoldPool = constructionInfo.m_persistentManifoldPool;
	}
	else
	{
		m_ownsPersistentManifoldPool = true;
		void* mem = cbtAlignedAlloc(sizeof(cbtPoolAllocator), 16);
		m_persistentManifoldPool = new (mem) cbtPoolAllocator(sizeof(cbtPersistentManifold), constructionInfo.m_defaultMaxPersistentManifoldPoolSize);
	}

	collisionAlgorithmMaxElementSize = (collisionAlgorithmMaxElementSize + 16) & 0xffffffffffff0;
	if (constructionInfo.m_collisionAlgorithmPool)
	{
		m_ownsCollisionAlgorithmPool = false;
		m_collisionAlgorithmPool = constructionInfo.m_collisionAlgorithmPool;
	}
	else
	{
		m_ownsCollisionAlgorithmPool = true;
		void* mem = cbtAlignedAlloc(sizeof(cbtPoolAllocator), 16);
		m_collisionAlgorithmPool = new (mem) cbtPoolAllocator(collisionAlgorithmMaxElementSize, constructionInfo.m_defaultMaxCollisionAlgorithmPoolSize);
	}
}